

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

void write_bdirect(char *outfile,int *a,int n,int nqx,int nqy,uchar *scratch,int bit)

{
  output_nybble(outfile,0);
  qtree_onebit(a,n,nqx,nqy,scratch,bit);
  output_nnybble(outfile,((nqy - (nqy + 1 >> 0x1f)) + 1 >> 1) * ((nqx - (nqx + 1 >> 0x1f)) + 1 >> 1)
                 ,scratch);
  return;
}

Assistant:

static void
write_bdirect(char *outfile, int a[], int n,int nqx, int nqy, unsigned char scratch[], int bit)
{

	/*
	 * Write the direct bitmap warning code
	 */
	output_nybble(outfile,0x0);
	/*
	 * Copy A to scratch array (again!), packing 4 bits/nybble
	 */
	qtree_onebit(a,n,nqx,nqy,scratch,bit);
	/*
	 * write to outfile
	 */
/*
int i;
	for (i = 0; i < ((nqx+1)/2) * ((nqy+1)/2); i++) {
		output_nybble(outfile,scratch[i]);
	}
*/
	output_nnybble(outfile, ((nqx+1)/2) * ((nqy+1)/2), scratch);

}